

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam.c
# Opt level: O0

void la_miam_file_transfer_abort_format_text(la_vstring *vstr,void *data,int indent)

{
  int in_EDX;
  ushort *in_RSI;
  la_vstring *in_RDI;
  char *descr;
  la_miam_file_transfer_abort_msg *msg;
  char *local_40;
  
  la_vstring_append_sprintf(in_RDI,"%*sFile ID: %u\n",(ulong)(in_EDX + 1U),"",(ulong)*in_RSI);
  local_40 = (char *)la_dict_search(la_miam_file_transfer_abort_format_text::abort_reasons,
                                    (uint)in_RSI[1]);
  if (local_40 == (char *)0x0) {
    local_40 = "unknown";
  }
  la_vstring_append_sprintf
            (in_RDI,"%*sReason: %u (%s)\n",(ulong)(in_EDX + 1U),"",(ulong)in_RSI[1],local_40);
  return;
}

Assistant:

static void la_miam_file_transfer_abort_format_text(la_vstring *vstr, void const *data, int indent) {
	static la_dict const abort_reasons[] = {
		{ .id = 0, .val = "File transfer request refused by receiver" },
		{ .id = 1, .val = "File segment out of context" },
		{ .id = 2, .val = "File transfer stopped by sender" },
		{ .id = 3, .val = "File transfer stopped by receiver" },
		{ .id = 4, .val = "File segment transmission failed" },
		{ .id = 0, .val = NULL }
	};
	la_assert(vstr);
	la_assert(data);
	la_assert(indent >= 0);

	la_miam_file_transfer_abort_msg const *msg = data;
	indent++;
	LA_ISPRINTF(vstr, indent, "File ID: %u\n", msg->file_id);
	char *descr = la_dict_search(abort_reasons, msg->reason);
	LA_ISPRINTF(vstr, indent, "Reason: %u (%s)\n", msg->reason,
			(descr != NULL ? descr : "unknown"));
}